

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O0

int Aig_ObjToLit(Aig_Obj_t *pObj)

{
  int iVar1;
  int c;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_local;
  
  pObj_00 = Aig_Regular(pObj);
  iVar1 = Aig_ObjId(pObj_00);
  c = Aig_IsComplement(pObj);
  iVar1 = Abc_Var2Lit(iVar1,c);
  return iVar1;
}

Assistant:

static inline int          Aig_ObjToLit( Aig_Obj_t * pObj )       { return Abc_Var2Lit( Aig_ObjId(Aig_Regular(pObj)), Aig_IsComplement(pObj) );       }